

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O0

int __thiscall baryonyx::problem::coefficient_type(problem *this)

{
  int *piVar1;
  int local_1c;
  int local_18;
  int ge;
  int le;
  int eq;
  problem *this_local;
  
  _le = this;
  ge = coefficient_type<std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>
                 (&this->equal_constraints);
  local_18 = coefficient_type<std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>
                       (&this->less_constraints);
  local_1c = coefficient_type<std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>
                       (&this->greater_constraints);
  piVar1 = std::max<int>(&local_18,&local_1c);
  piVar1 = std::max<int>(&ge,piVar1);
  return *piVar1;
}

Assistant:

int coefficient_type() noexcept
    {
        int eq = coefficient_type(equal_constraints);
        int le = coefficient_type(less_constraints);
        int ge = coefficient_type(greater_constraints);

        return std::max(eq, std::max(le, ge));
    }